

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LoadConstantNDLayerParams::InternalSwap
          (LoadConstantNDLayerParams *this,LoadConstantNDLayerParams *other)

{
  int iVar1;
  WeightParams *pWVar2;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->shape_,&other->shape_);
  pWVar2 = this->data_;
  this->data_ = other->data_;
  other->data_ = pWVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void LoadConstantNDLayerParams::InternalSwap(LoadConstantNDLayerParams* other) {
  shape_.InternalSwap(&other->shape_);
  std::swap(data_, other->data_);
  std::swap(_cached_size_, other->_cached_size_);
}